

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O2

void fiobj_ary_set(FIOBJ ary,FIOBJ obj,int64_t pos)

{
  size_t sVar1;
  long lVar2;
  FIOBJ o;
  long lVar3;
  
  if (ary != 0) {
    sVar1 = fiobj_type_is(ary,(fiobj_type_enum)obj);
    if (sVar1 != 0) {
      lVar2 = *(long *)(ary + 8);
      lVar3 = *(long *)(ary + 0x10);
      if (lVar2 == lVar3) {
        ((fio_ary___s *)(ary + 8))->start = 0;
        *(undefined8 *)(ary + 0x10) = 0;
        lVar2 = 0;
        lVar3 = 0;
      }
      if (pos < 0) {
        pos = (pos - lVar2) + lVar3;
        if (pos < 1) {
          pos = 0;
        }
      }
      lVar3 = (lVar2 - lVar3) + pos;
      if (lVar3 < 0) {
        lVar2 = lVar2 * 8 + *(long *)(ary + 0x20);
        o = *(FIOBJ *)(lVar2 + pos * 8);
        *(FIOBJ *)(lVar2 + pos * 8) = obj;
      }
      else {
        fio_ary_____require_on_top((fio_ary___s *)(ary + 8),lVar3 + 1);
        if (lVar3 != 0) {
          memset((void *)(*(long *)(ary + 0x10) * 8 + *(long *)(ary + 0x20)),0,lVar3 * 8);
        }
        *(FIOBJ *)(*(long *)(ary + 8) * 8 + *(long *)(ary + 0x20) + pos * 8) = obj;
        *(int64_t *)(ary + 0x10) = pos + 1;
        o = 0;
      }
      fiobj_free(o);
      return;
    }
  }
  __assert_fail("ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_ary.c"
                ,0x8c,"void fiobj_ary_set(FIOBJ, FIOBJ, int64_t)");
}

Assistant:

void fiobj_ary_set(FIOBJ ary, FIOBJ obj, int64_t pos) {
  assert(ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY));
  FIOBJ old = FIOBJ_INVALID;
  fio_ary___set(&obj2ary(ary)->ary, pos, obj, &old);
  fiobj_free(old);
}